

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O3

void __thiscall
SplitCompilationTest_empty_long_Test<char8_t>::TestBody
          (SplitCompilationTest_empty_long_Test<char8_t> *this)

{
  pointer *__ptr;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  in_R9;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> delim;
  AssertHelper local_70 [8];
  long *local_68;
  byte local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined1 local_50 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_20;
  
  make_delim_long<char8_t,std::__cxx11::u8string>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)&local_30
             ,8,'\0');
  jessilib::
  split<std::vector,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_const_char8_t_*,_const_char8_t_*,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
            ((container_type *)local_50,(char8_t *)0x0,(char8_t *)0x0,
             (__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              )local_30._M_allocated_capacity,
             (char8_t *)(local_30._8_8_ + local_30._M_allocated_capacity));
  local_60[0] = local_50._0_8_ == local_50._8_8_;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_50._8_8_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) goto LAB_0038569d;
LAB_003855f9:
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,(char *)local_60,"split_view(empty, delim).empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x35,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,(ulong)((long)(size_t *)local_50._16_8_ + 1));
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  else {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ - local_50._0_8_);
    if ((local_60[0] & 1) == 0) goto LAB_003855f9;
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
LAB_0038569d:
  jessilib::
  split_once<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t_const*,char8_t_const*,__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>,__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>>
            ((pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
              *)local_50,(jessilib *)0x0,(char8_t *)0x0,(char8_t *)local_30._M_allocated_capacity,
             (char8_t *)(local_30._8_8_ + local_30._M_allocated_capacity),in_R9);
  local_60[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_60[0]) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,(char *)local_60,
               "split_once_view(empty, delim).first.empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,0x36,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,(ulong)((long)(size_t *)local_50._16_8_ + 1));
    }
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_30._M_allocated_capacity != &local_20) {
    operator_delete((void *)local_30._M_allocated_capacity,local_20._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_long) {
	// string_view w/ long delimiter
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split_view(empty, delim).empty());
	EXPECT_TRUE(split_once_view(empty, delim).first.empty());
}